

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::jsonStreamData(Config *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_stream_data_set = true;
  bVar1 = std::operator==(parameter,"none");
  if (bVar1) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    json_stream_data = qpdf_sj_none;
  }
  else {
    bVar1 = std::operator==(parameter,"inline");
    if (bVar1) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_stream_data = qpdf_sj_inline;
    }
    else {
      bVar1 = std::operator==(parameter,"file");
      if (bVar1) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        json_stream_data = qpdf_sj_file;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"invalid json-streams option",&local_31);
        usage(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jsonStreamData(std::string const& parameter)
{
    o.m->json_stream_data_set = true;
    if (parameter == "none") {
        o.m->json_stream_data = qpdf_sj_none;
    } else if (parameter == "inline") {
        o.m->json_stream_data = qpdf_sj_inline;
    } else if (parameter == "file") {
        o.m->json_stream_data = qpdf_sj_file;
    } else {
        usage("invalid json-streams option");
    }

    return this;
}